

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dec_api.c
# Opt level: O3

MPP_RET dummy_dec_init(void *dec,ParserCfg *cfg)

{
  MppBufSlots pvVar1;
  MPP_RET MVar2;
  MppPacket in_RAX;
  void *data;
  MppPacket task_pkt;
  MppPacket local_28;
  
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"dummy_dec_api","found NULL intput dec %p cfg %p\n","dummy_dec_init",0,cfg);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    local_28 = in_RAX;
    data = mpp_osal_malloc("dummy_dec_init",0x80000);
    if (data == (void *)0x0) {
      _mpp_log_l(2,"dummy_dec_api","failed to malloc stream buffer size %d\n","dummy_dec_init",
                 0x80000);
      MVar2 = MPP_ERR_MALLOC;
    }
    else {
      mpp_packet_init(&local_28,data,0x80000);
      if (local_28 == (MppPacket)0x0) {
        _mpp_log_l(2,"dummy_dec_api","failed to create mpp_packet for task\n","dummy_dec_init");
        MVar2 = MPP_ERR_UNKNOW;
      }
      else {
        pvVar1 = cfg->packet_slots;
        *(MppBufSlots *)dec = cfg->frame_slots;
        *(MppBufSlots *)((long)dec + 8) = pvVar1;
        *(undefined4 *)((long)dec + 0x10) = 2;
        *(void **)((long)dec + 0x18) = data;
        *(undefined8 *)((long)dec + 0x20) = 0x80000;
        *(MppPacket *)((long)dec + 0x28) = local_28;
        *(undefined8 *)((long)dec + 0x48) = 0xffffffffffffffff;
        MVar2 = MPP_OK;
      }
    }
  }
  return MVar2;
}

Assistant:

MPP_RET dummy_dec_init(void *dec, ParserCfg *cfg)
{
    DummyDec *p;
    RK_S32 i;
    void *stream;
    size_t stream_size = SZ_512K;
    MppPacket task_pkt;

    if (NULL == dec) {
        mpp_err_f("found NULL intput dec %p cfg %p\n", dec, cfg);
        return MPP_ERR_NULL_PTR;
    }

    stream = mpp_malloc_size(void, stream_size);
    if (NULL == stream) {
        mpp_err_f("failed to malloc stream buffer size %d\n", stream_size);
        return MPP_ERR_MALLOC;
    }

    mpp_packet_init(&task_pkt, stream, stream_size);
    if (NULL == task_pkt) {
        mpp_err_f("failed to create mpp_packet for task\n");
        return MPP_ERR_UNKNOW;
    }

    p = (DummyDec *)dec;
    p->frame_slots  = cfg->frame_slots;
    p->packet_slots = cfg->packet_slots;
    p->task_count   = 2;
    p->stream       = stream;
    p->stream_size  = stream_size;
    p->task_pkt     = task_pkt;
    for (i = 0; i < DUMMY_DEC_REF_COUNT; i++) {
        p->slot_index[i] = -1;
    }
    return MPP_OK;
}